

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O1

void Corrade::Containers::ArrayMallocAllocator<char>::reallocate
               (char **array,size_t param_2,size_t newCapacity)

{
  size_t *psVar1;
  Debug *pDVar2;
  char *__size;
  long in_FS_OFFSET;
  Error local_40;
  char *local_18;
  
  __size = (char *)(newCapacity + 8);
  psVar1 = (size_t *)realloc(*array + -8,(size_t)__size);
  if (psVar1 != (size_t *)0x0) {
    *psVar1 = (size_t)__size;
    *array = (char *)(psVar1 + 1);
    return;
  }
  local_40.super_Debug._previousGlobalOutput = *(ostream **)(in_FS_OFFSET + -0x20);
  local_40.super_Debug._flags._value = '\0';
  local_40.super_Debug._immediateFlags._value = '\x04';
  local_40.super_Debug._internalFlags._value = 0;
  local_40.super_Debug._sourceLocationLine = 0;
  local_40.super_Debug._sourceLocationFile = (char *)0x0;
  local_40.super_Debug._previousColor = *(Color *)(in_FS_OFFSET + -8);
  if (*(char *)(in_FS_OFFSET + -7) == '\x01') {
    local_40.super_Debug._internalFlags._value = 8;
  }
  if (*(char *)(in_FS_OFFSET + -6) == '\x01') {
    local_40.super_Debug._internalFlags._value = local_40.super_Debug._internalFlags._value | 0x10;
  }
  local_40._previousGlobalErrorOutput = *(ostream **)(in_FS_OFFSET + -0x10);
  local_40.super_Debug._output = (ostream *)&std::cerr;
  *(undefined8 **)(in_FS_OFFSET + -0x10) = &std::cerr;
  local_18 = "Containers::ArrayMallocAllocator: can\'t reallocate";
  pDVar2 = Utility::Debug::print<char_const*>(&local_40.super_Debug,&local_18);
  local_18 = __size;
  pDVar2 = Utility::Debug::print<unsigned_long>(pDVar2,(unsigned_long *)&local_18);
  Utility::Debug::operator<<(pDVar2,"bytes");
  Utility::Error::~Error(&local_40);
  abort();
}

Assistant:

void ArrayMallocAllocator<T>::reallocate(T*& array, std::size_t, const std::size_t newCapacity) {
    const std::size_t inBytes = newCapacity*sizeof(T) + AllocationOffset;
    char* const memory = static_cast<char*>(std::realloc(reinterpret_cast<char*>(array) - AllocationOffset, inBytes));
    CORRADE_ASSERT(memory,
        "Containers::ArrayMallocAllocator: can't reallocate" << inBytes << "bytes", );
    reinterpret_cast<std::size_t*>(memory)[0] = inBytes;
    array = reinterpret_cast<T*>(memory + AllocationOffset);
}